

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

size_t ltmsize(void *p)

{
  uint uVar1;
  size_t size;
  void *p_local;
  
  if (((ulong)p & 0xffff) == 0) {
    if (p == (void *)0x0) {
      p_local = (void *)0x0;
    }
    else {
      p_local = (void *)ptrie_lookup(&largeAllocSizes,(uintptr_t)p);
    }
  }
  else {
    uVar1 = class_to_size(*(uint *)((ulong)p & 0xffffffffffff0000));
    p_local = (void *)(ulong)uVar1;
  }
  return (size_t)p_local;
}

Assistant:

size_t ltmsize(void* p)
{
	if (likely((uintptr_t)p & (CHUNK_SIZE - 1)))
	{
		return class_to_size(((Chunk*)((uintptr_t)p & ~(CHUNK_SIZE - 1)))->sizeClass);
	}
	else
	{
		if (p == NULL) return 0;

#if LTALLOC_HAS_VMSIZE
		size_t size = LTALLOC_VMSIZE(p);
#else
		size_t size = ptrie_lookup(&largeAllocSizes, (uintptr_t)p);
#endif

#ifdef LTALLOC_OVERFLOW_DETECTION
		size -= LTALLOC_CANARY_SIZE;
#endif

		return size;
	}
}